

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclPrintBuffers(SC_Lib *pLib,Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  SC_Man *p_00;
  SC_Man *p;
  int fUseWireLoads;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  
  iVar1 = Abc_NtkIsMappedLogic(pNtk);
  if (iVar1 != 0) {
    p_00 = Abc_SclManStart(pLib,pNtk,0,1,0.0,10000);
    Abc_SclPrintBufferTrees(p_00,pNtk);
    Abc_SclManFree(p_00);
    return;
  }
  __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                ,0x385,"void Abc_SclPrintBuffers(SC_Lib *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_SclPrintBuffers( SC_Lib * pLib, Abc_Ntk_t * pNtk, int fVerbose )
{
    int fUseWireLoads = 0;
    SC_Man * p;
    assert( Abc_NtkIsMappedLogic(pNtk) );
    p = Abc_SclManStart( pLib, pNtk, fUseWireLoads, 1, 0, 10000 ); 
    Abc_SclPrintBufferTrees( p, pNtk ); 
//    Abc_SclPrintFaninPairs( p, pNtk );
    Abc_SclManFree( p );
}